

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

void ddb_ap(long ndims,double *qedims,Integer *ardims,Integer *pedims,long npes,long npdivs,
           long *pdivs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  long local_60;
  
  local_60 = npes;
  if (1 < ndims) {
    lVar6 = 0;
    do {
      lVar2 = dd_lk(pdivs,npdivs,qedims[lVar6]);
      lVar1 = pdivs[lVar2];
      pedims[lVar6] = lVar1;
      local_60 = local_60 / lVar1;
      if (local_60 < 2) {
        local_60 = 1;
      }
      lVar5 = npdivs;
      if (lVar6 < ndims + -2) {
        dVar7 = (double)local_60;
        qedims[lVar6 + 1] = dVar7;
        lVar4 = lVar6 + 2;
        lVar3 = lVar4;
        do {
          dVar7 = dVar7 / ((double)ardims[lVar3] / (double)ardims[lVar6 + 1]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < ndims);
        qedims[lVar6 + 1] = dVar7;
        dVar7 = pow(dVar7,1.0 / (double)((ndims + -1) - lVar6));
        qedims[lVar6 + 1] = dVar7;
        if (lVar4 < ndims) {
          lVar3 = ardims[lVar6 + 1];
          do {
            qedims[lVar4] = ((double)ardims[lVar4] / (double)lVar3) * qedims[lVar6 + 1];
            lVar4 = lVar4 + 1;
          } while (lVar4 < ndims);
        }
        if (1 < lVar1) {
          lVar2 = lVar2 + 1;
          lVar5 = 1;
          if (lVar2 < npdivs) {
            do {
              if (pdivs[lVar2] % lVar1 == 0) {
                pdivs[lVar5] = pdivs[lVar2] / lVar1;
                lVar5 = lVar5 + 1;
              }
              lVar2 = lVar2 + 1;
            } while (npdivs != lVar2);
          }
        }
      }
      lVar6 = lVar6 + 1;
      npdivs = lVar5;
    } while (lVar6 != ndims + -1);
  }
  pedims[ndims + -1] = local_60;
  return;
}

Assistant:

void ddb_ap(long ndims, double * qedims, Integer * ardims, Integer * pedims,
                  long npes, long npdivs, long * pdivs)
      {
      long bq;
      long i, k, g;
      long idim;
         for(idim=0;idim<ndims-1;idim++){
            g = dd_lk(pdivs,npdivs,qedims[idim]);
            bq = pdivs[g] ;
            pedims[idim] = bq;
            npes /= bq;
            npes = (npes<1) ? 1 : npes;
            if(idim<ndims-2){
               qedims[idim+1] = (double) npes;
               for(i=idim+2;i<ndims;i++) qedims[idim+1] /=
                   (ardims[i]/(double)ardims[idim+1]);
               qedims[idim+1] = (double) pow(qedims[idim+1],
                   1.0/(double)(ndims-1-idim));
               for(i=idim+2;i<ndims;i++){
                   qedims[i] = (ardims[i]/(double)ardims[idim+1])*
                       qedims[idim+1];
               }

               if(bq>1) {
                   for(k=1,i=g+1;i<npdivs;i++){
                       if(pdivs[i]%bq==0) {
                           pdivs[k] = pdivs[i]/bq;
                           k += 1;
                       }
                   }
                   npdivs = k;
               }
            }
         }
         pedims[ndims-1] = npes;
      }